

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

bsp_size_t bsp_hpmove(void **tag_ptr,void **payload_ptr)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  size_t size;
  undefined1 local_40 [8];
  TicToc t;
  void **payload_ptr_local;
  void **tag_ptr_local;
  
  t.m_nbytes = (size_t)payload_ptr;
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_hpmove: can only be called within SPMD section\n");
  }
  bsplib::TicToc::TicToc((TicToc *)local_40,BSMP,0);
  if ((tag_ptr == (void **)0x0) || (t.m_nbytes == 0)) {
    bsp_abort("bsp_hpmove: pointer arugments may not be NULL\n");
  }
  bVar1 = bsplib::Bsmp::empty(s_bsmp);
  if (bVar1) {
    tag_ptr_local._4_4_ = -1;
  }
  else {
    sVar2 = bsplib::Bsmp::payload_size(s_bsmp);
    bsplib::TicToc::add_bytes((TicToc *)local_40,sVar2);
    pvVar3 = bsplib::Bsmp::tag(s_bsmp);
    *tag_ptr = pvVar3;
    pvVar3 = bsplib::Bsmp::payload(s_bsmp);
    *(void **)t.m_nbytes = pvVar3;
    sVar2 = bsplib::Bsmp::payload_size(s_bsmp);
    bsplib::Bsmp::pop(s_bsmp);
    tag_ptr_local._4_4_ = (bsp_size_t)sVar2;
  }
  bsplib::TicToc::~TicToc((TicToc *)local_40);
  return tag_ptr_local._4_4_;
}

Assistant:

bsp_size_t bsp_hpmove( void ** tag_ptr, void ** payload_ptr )
{
     if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_hpmove: can only be called within SPMD section\n");

#ifdef PROFILE
     TicToc t( TicToc::BSMP );
#endif

     if ( tag_ptr == NULL || payload_ptr == NULL )
        bsp_abort("bsp_hpmove: pointer arugments may not be NULL\n");

     if ( s_bsmp->empty() )
         return bsp_size_t(-1);

#ifdef PROFILE
     t.add_bytes( s_bsmp->payload_size() );
#endif

     *tag_ptr = s_bsmp->tag();
     *payload_ptr = s_bsmp->payload();
     size_t size = s_bsmp->payload_size();
     s_bsmp->pop();
     return static_cast<bsp_size_t>( size );
}